

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void write_color(ostream *out,color *pixel_color)

{
  int iVar1;
  ostream *poVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int bbyte;
  int gbyte;
  int rbyte;
  double b;
  double g;
  double r;
  color *pixel_color_local;
  ostream *out_local;
  
  dVar3 = vec3::x(pixel_color);
  dVar4 = vec3::y(pixel_color);
  dVar5 = vec3::z(pixel_color);
  dVar3 = linear_to_gamma(dVar3);
  dVar4 = linear_to_gamma(dVar4);
  dVar5 = linear_to_gamma(dVar5);
  if (write_color(std::ostream&,vec3_const&)::intensity == '\0') {
    iVar1 = __cxa_guard_acquire(&write_color(std::ostream&,vec3_const&)::intensity);
    if (iVar1 != 0) {
      interval::interval(&write_color::intensity,0.0,0.999);
      __cxa_guard_release(&write_color(std::ostream&,vec3_const&)::intensity);
    }
  }
  dVar3 = interval::clamp(&write_color::intensity,dVar3);
  dVar4 = interval::clamp(&write_color::intensity,dVar4);
  dVar5 = interval::clamp(&write_color::intensity,dVar5);
  poVar2 = (ostream *)std::ostream::operator<<(out,(int)(dVar3 * 256.0));
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)(dVar4 * 256.0));
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)(dVar5 * 256.0));
  std::operator<<(poVar2,'\n');
  return;
}

Assistant:

void write_color(std::ostream& out, const color& pixel_color) {
    auto r = pixel_color.x();
    auto g = pixel_color.y();
    auto b = pixel_color.z();

    // Apply a linear to gamma transform for gamma 2
    r = linear_to_gamma(r);
    g = linear_to_gamma(g);
    b = linear_to_gamma(b);

    // Translate the [0,1] component values to the byte range [0,255].
    static const interval intensity(0.000, 0.999);
    int rbyte = int(256 * intensity.clamp(r));
    int gbyte = int(256 * intensity.clamp(g));
    int bbyte = int(256 * intensity.clamp(b));

    // Write out the pixel color components.
    out << rbyte << ' ' << gbyte << ' ' << bbyte << '\n';
}